

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGearConstraint.h
# Opt level: O2

char * __thiscall
btGearConstraint::serialize(btGearConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btVector3::serialize(&this->m_axisInA,(btVector3FloatData *)((long)dataBuffer + 0x40));
  btVector3::serialize(&this->m_axisInB,(btVector3FloatData *)((long)dataBuffer + 0x50));
  *(btScalar *)((long)dataBuffer + 0x60) = this->m_ratio;
  return "btGearConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGearConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGearConstraintData* gear = (btGearConstraintData*)dataBuffer;
	btTypedConstraint::serialize(&gear->m_typeConstraintData,serializer);

	m_axisInA.serialize( gear->m_axisInA );
	m_axisInB.serialize( gear->m_axisInB );

	gear->m_ratio = m_ratio;

	return btGearConstraintDataName;
}